

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_280db::ArenaTest_FuzzAllocSpaceAllocatedRace_Test::TestBody
          (ArenaTest_FuzzAllocSpaceAllocatedRace_Test *this)

{
  bool bVar1;
  upb_Arena *a;
  void *pvVar2;
  Time TVar3;
  Duration rhs;
  Time lhs;
  thread *t;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  ulong local_f0;
  uintptr_t total;
  uint32_t local_e0;
  Time end;
  int local_5c;
  undefined1 local_58 [4];
  int i;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  Notification done;
  upb_Arena *arena;
  ArenaTest_FuzzAllocSpaceAllocatedRace_Test *pAStack_10;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_upb_mem_arena_test_cc:618:40)>
  reset_max_block_size;
  ArenaTest_FuzzAllocSpaceAllocatedRace_Test *this_local;
  
  pAStack_10 = this;
  upb_Arena_SetMaxBlockSize(0x80);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena_test.cc:618:40)>
  ::Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_upb_mem_arena_test_cc:618:40)>
             *)((long)&arena + 6));
  a = upb_Arena_New();
  absl::lts_20250127::Notification::Notification
            ((Notification *)
             &threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_58);
  for (local_5c = 0; local_5c < 1; local_5c = local_5c + 1) {
    end.rep_._4_8_ =
         &threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<(anonymous_namespace)::ArenaTest_FuzzAllocSpaceAllocatedRace_Test::TestBody()::__1>
              ((vector<std::thread,std::allocator<std::thread>> *)local_58,
               (type *)&end.rep_.rep_hi_.hi_);
  }
  TVar3 = absl::lts_20250127::Now();
  rhs = absl::lts_20250127::Seconds<int,_0>(2);
  TVar3 = absl::lts_20250127::operator+(TVar3,rhs);
  total = (uintptr_t)TVar3.rep_.rep_hi_;
  local_e0 = TVar3.rep_.rep_lo_;
  end.rep_.rep_hi_.lo_ = local_e0;
  local_f0 = 0;
  while( true ) {
    lhs = absl::lts_20250127::Now();
    TVar3.rep_.rep_lo_ = end.rep_.rep_hi_.lo_;
    TVar3.rep_.rep_hi_.lo_ = (undefined4)total;
    TVar3.rep_.rep_hi_.hi_ = total._4_4_;
    bVar1 = absl::lts_20250127::operator<(lhs,TVar3);
    if ((!bVar1 || 9999999 < local_f0) ||
       (pvVar2 = ::upb_Arena_Malloc(a,0x80), pvVar2 == (void *)0x0)) break;
    local_f0 = local_f0 + 0x80;
  }
  absl::lts_20250127::Notification::Notify
            ((Notification *)
             &threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  __end1 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                     ((vector<std::thread,_std::allocator<std::thread>_> *)local_58);
  t = (thread *)
      std::vector<std::thread,_std::allocator<std::thread>_>::end
                ((vector<std::thread,_std::allocator<std::thread>_> *)local_58);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                     *)&t), bVar1) {
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*(&__end1);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&__end1);
  }
  upb_Arena_Free(a);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_58);
  absl::lts_20250127::Notification::~Notification
            ((Notification *)
             &threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena_test.cc:618:40)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_upb_mem_arena_test_cc:618:40)>
              *)((long)&arena + 6));
  return;
}

Assistant:

TEST(ArenaTest, FuzzAllocSpaceAllocatedRace) {
  upb_Arena_SetMaxBlockSize(128);
  absl::Cleanup reset_max_block_size = [] {
    upb_Arena_SetMaxBlockSize(UPB_PRIVATE(kUpbDefaultMaxBlockSize));
  };
  upb_Arena* arena = upb_Arena_New();
  absl::Notification done;
  std::vector<std::thread> threads;
  for (int i = 0; i < 1; ++i) {
    threads.emplace_back([&]() {
      while (!done.HasBeenNotified()) {
        size_t count;
        upb_Arena_SpaceAllocated(arena, &count);
      }
    });
  }

  auto end = absl::Now() + absl::Seconds(2);
  uintptr_t total = 0;
  while (absl::Now() < end && total < 10000000) {
    if (upb_Arena_Malloc(arena, 128) == nullptr) {
      break;
    }
    total += 128;
  }
  done.Notify();
  for (auto& t : threads) t.join();
  upb_Arena_Free(arena);
}